

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialBus.cpp
# Opt level: O3

void __thiscall Commodore::Serial::DebugPort::set_input(DebugPort *this,Line line,LineLevel value)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  
  this->input_levels_[line] = value;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[Bus] ",6);
  if (line < (Reset|Attention)) {
    pcVar3 = (&PTR_anon_var_dwarf_b2c2f1_005974e0)[line];
    sVar2 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,sVar2);
  }
  else {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x5b6310);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," is ",4);
  pcVar3 = "low";
  if (value != Low) {
    pcVar3 = "high";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,(ulong)value + 3);
  iVar1 = this->incoming_count_;
  if (iVar1 == 0) {
    this->incoming_count_ = ((byte)~(this->input_levels_[3] | this->input_levels_[2]) & 1) << 3;
  }
  else {
    if (value == High && line == Clock) {
      (this->super_Port).field_0x1d =
           this->input_levels_[3] << 7 | (byte)(this->super_Port).field_0x1d >> 1;
    }
    iVar1 = iVar1 + -1;
    this->incoming_count_ = iVar1;
    if (iVar1 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"[Bus] Observed value ",0x15);
      *(uint *)(&unsigned_int::typeinfo + *(long *)(std::cout + -0x18)) =
           *(uint *)(&unsigned_int::typeinfo + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
      std::ostream::operator<<((ostream *)&std::cout,(uint)(byte)(this->super_Port).field_0x1d);
      return;
    }
  }
  return;
}

Assistant:

void DebugPort::set_input(Line line, LineLevel value) {
	input_levels_[line] = value;

	std::cout << "[Bus] " << StringForLine(line) << " is " << (value ? "high" : "low");
	if(!incoming_count_) {
		incoming_count_ = (!input_levels_[Line::Clock] && !input_levels_[Line::Data]) ? 8 : 0;
	} else {
		if(line == Line::Clock && value) {
			incoming_byte_ = (incoming_byte_ >> 1) | (input_levels_[Line::Data] ? 0x80 : 0x00);
		}
		incoming_count_--;
		if(incoming_count_ == 0) std::cout << "[Bus] Observed value " << std::hex << int(incoming_byte_);
	}
}